

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::UnaryFunctionLayerParams::_InternalParse
          (UnaryFunctionLayerParams *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  float *p;
  char cVar5;
  uint uVar6;
  pair<const_char_*,_unsigned_int> pVar7;
  pair<const_char_*,_unsigned_long> pVar8;
  float *local_38;
  
  local_38 = (float *)ptr;
  bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar2) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *(byte *)local_38;
      uVar6 = (uint)bVar1;
      p = (float *)((long)local_38 + 1);
      if ((char)bVar1 < '\0') {
        uVar6 = ((uint)bVar1 + (uint)*(byte *)p * 0x80) - 0x80;
        if ((char)*(byte *)p < '\0') {
          pVar7 = google::protobuf::internal::ReadTagFallback((char *)local_38,uVar6);
          p = (float *)pVar7.first;
          uVar6 = pVar7.second;
        }
        else {
          p = (float *)((long)local_38 + 2);
        }
      }
      cVar5 = (char)uVar6;
      local_38 = p;
      switch(uVar6 >> 3) {
      case 1:
        if (cVar5 != '\b') break;
        uVar4 = (ulong)(char)*(byte *)p;
        local_38 = (float *)((long)p + 1);
        if ((long)uVar4 < 0) {
          uVar6 = ((uint)*(byte *)local_38 * 0x80 + (uint)*(byte *)p) - 0x80;
          if (-1 < (char)*(byte *)local_38) {
            uVar4 = (ulong)uVar6;
            local_38 = (float *)((long)p + 2);
            goto LAB_00271983;
          }
          local_38 = p;
          pVar8 = google::protobuf::internal::VarintParseSlow64((char *)p,uVar6);
          iVar3 = (int)pVar8.second;
          local_38 = (float *)pVar8.first;
          if (local_38 == (float *)0x0) {
            return (char *)0x0;
          }
        }
        else {
LAB_00271983:
          iVar3 = (int)uVar4;
        }
        this->type_ = iVar3;
        goto LAB_002719db;
      case 2:
        if (cVar5 == '\x15') {
          this->alpha_ = *p;
LAB_002719d3:
          local_38 = p + 1;
          goto LAB_002719db;
        }
        break;
      case 3:
        if (cVar5 == '\x1d') {
          this->epsilon_ = *p;
          goto LAB_002719d3;
        }
        break;
      case 4:
        if (cVar5 == '%') {
          this->shift_ = *p;
          goto LAB_002719d3;
        }
        break;
      case 5:
        if (cVar5 == '-') {
          this->scale_ = *p;
          goto LAB_002719d3;
        }
      }
      if ((uVar6 == 0) || ((uVar6 & 7) == 4)) {
        if (p == (float *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = uVar6 - 1;
        return (char *)p;
      }
      uVar4 = this_00->ptr_;
      if ((uVar4 & 1) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((uVar4 & 0xfffffffffffffffc) + 8);
      }
      local_38 = (float *)google::protobuf::internal::UnknownFieldParse
                                    (uVar6,unknown,(char *)local_38,ctx);
      if (local_38 == (float *)0x0) {
        return (char *)0x0;
      }
LAB_002719db:
      bVar2 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar2);
  }
  return (char *)local_38;
}

Assistant:

const char* UnaryFunctionLayerParams::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.UnaryFunctionLayerParams.Operation type = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 8)) {
          uint64_t val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint64(&ptr);
          CHK_(ptr);
          _internal_set_type(static_cast<::CoreML::Specification::UnaryFunctionLayerParams_Operation>(val));
        } else
          goto handle_unusual;
        continue;
      // float alpha = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 21)) {
          alpha_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // float epsilon = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 29)) {
          epsilon_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // float shift = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 37)) {
          shift_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      // float scale = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 45)) {
          scale_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<float>(ptr);
          ptr += sizeof(float);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}